

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

VkResult Fossilize::CreateDescriptorSetLayout
                   (VkDevice device,VkDescriptorSetLayoutCreateInfo *pCreateInfo,
                   VkAllocationCallbacks *pAllocator,VkDescriptorSetLayout *pSetLayout)

{
  bool bVar1;
  VkResult VVar2;
  LogLevel LVar3;
  Device *pDVar4;
  
  pDVar4 = get_device_layer(*(VkDevice *)device);
  VVar2 = (*pDVar4->pTable->CreateDescriptorSetLayout)(device,pCreateInfo,pAllocator,pSetLayout);
  if ((VVar2 == VK_SUCCESS) && ((pCreateInfo->flags & 4) == 0)) {
    bVar1 = StateRecorder::record_descriptor_set_layout(pDVar4->recorder,*pSetLayout,pCreateInfo,0);
    if (!bVar1) {
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 2) {
        bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to record descriptor set layout, usually caused by unsupported pNext.\n"
                          );
        if (!bVar1) {
          CreateDescriptorSetLayout();
        }
      }
    }
  }
  return VVar2;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateDescriptorSetLayout(VkDevice device,
                                                                const VkDescriptorSetLayoutCreateInfo *pCreateInfo,
                                                                const VkAllocationCallbacks *pAllocator,
                                                                VkDescriptorSetLayout *pSetLayout)
{
	auto *layer = get_device_layer(device);

	VkResult result = layer->getTable()->CreateDescriptorSetLayout(device, pCreateInfo, pAllocator, pSetLayout);

	// No point in recording a host only layout since we will never be able to use it in a pipeline layout.
	if (result == VK_SUCCESS && (pCreateInfo->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_HOST_ONLY_POOL_BIT_EXT) == 0)
	{
		if (!layer->getRecorder().record_descriptor_set_layout(*pSetLayout, *pCreateInfo))
			LOGW_LEVEL("Failed to record descriptor set layout, usually caused by unsupported pNext.\n");
	}
	return result;
}